

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

optional<unsigned_int> slang::strToUInt(string_view str,size_t *pos,int base)

{
  const_pointer pvVar1;
  optional<unsigned_int> *this;
  uint *puVar2;
  long *in_RDX;
  __integer_from_chars_result_type<unsigned_int> _Var3;
  __integer_from_chars_result_type<unsigned_int> result;
  uint32_t value;
  uint *in_stack_ffffffffffffffa8;
  int __base;
  uint *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  _Optional_payload_base<unsigned_int> local_8;
  
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  __base = (int)((ulong)pvVar1 >> 0x20);
  this = (optional<unsigned_int> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  _Var3 = std::from_chars<unsigned_int>
                    ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,__base);
  puVar2 = (uint *)_Var3.ptr;
  if (_Var3.ec == 0) {
    if (in_RDX != (long *)0x0) {
      pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
      *in_RDX = (long)puVar2 - (long)pvVar1;
      in_stack_ffffffffffffffa8 = puVar2;
    }
    std::optional<unsigned_int>::optional<unsigned_int,_true>(this,in_stack_ffffffffffffffa8);
  }
  else {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_8);
  }
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<uint32_t> strToUInt(std::string_view str, size_t* pos, int base) {
    uint32_t value;
    auto result = std::from_chars(str.data(), str.data() + str.size(), value, base);
    if (result.ec != std::errc())
        return std::nullopt;

    if (pos)
        *pos = size_t(result.ptr - str.data());
    return value;
}